

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_t_impl.hpp
# Opt level: O2

ostream * toml::operator<<(ostream *os,value_t t)

{
  char *pcVar1;
  
  if (t < (table|boolean)) {
    pcVar1 = &DAT_00334b90 + *(int *)(&DAT_00334b90 + (ulong)t * 4);
  }
  else {
    pcVar1 = "unknown";
  }
  std::operator<<(os,pcVar1);
  return os;
}

Assistant:

TOML11_INLINE std::ostream& operator<<(std::ostream& os, value_t t)
{
    switch(t)
    {
        case value_t::boolean         : os << "boolean";         return os;
        case value_t::integer         : os << "integer";         return os;
        case value_t::floating        : os << "floating";        return os;
        case value_t::string          : os << "string";          return os;
        case value_t::offset_datetime : os << "offset_datetime"; return os;
        case value_t::local_datetime  : os << "local_datetime";  return os;
        case value_t::local_date      : os << "local_date";      return os;
        case value_t::local_time      : os << "local_time";      return os;
        case value_t::array           : os << "array";           return os;
        case value_t::table           : os << "table";           return os;
        case value_t::empty           : os << "empty";           return os;
        default                       : os << "unknown";         return os;
    }
}